

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O0

Any __thiscall amrex::MLLinOp::AnyMake(MLLinOp *this,int amrlev,int mglev,IntVect *ng)

{
  undefined4 uVar1;
  DistributionMapping *pDVar2;
  MultiFab *mf;
  IntVect *in_RSI;
  BoxArray *in_RDI;
  BoxArray *in_R8;
  size_type in_stack_fffffffffffffd78;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *in_stack_fffffffffffffd80;
  _Head_base<0UL,_amrex::Any::innards_base_*,_false> ba;
  int ncomp;
  undefined4 in_stack_fffffffffffffdb0;
  BoxArray *bxs;
  MultiFab *this_00;
  FabFactory<amrex::FArrayBox> *factory;
  
  ba._M_head_impl = (innards_base *)in_RDI;
  Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  convert((BoxArray *)ba._M_head_impl,(IntVect *)in_RDI);
  Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  pDVar2 = Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
           operator[]((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                       *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  ncomp = (int)((ulong)pDVar2 >> 0x20);
  uVar1 = (**(code **)(*(long *)in_RSI->vect + 0x28))();
  factory = (FabFactory<amrex::FArrayBox> *)0x0;
  bxs = (BoxArray *)0x0;
  this_00 = (MultiFab *)0x0;
  MFInfo::MFInfo((MFInfo *)0x150c6d3);
  Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                *)in_R8,in_stack_fffffffffffffd78);
  Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                *)in_R8,in_stack_fffffffffffffd78);
  mf = (MultiFab *)
       std::
       unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
       ::operator*((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                    *)in_R8);
  MultiFab::MultiFab(this_00,bxs,(DistributionMapping *)CONCAT44(uVar1,in_stack_fffffffffffffdb0),
                     ncomp,in_RSI,(MFInfo *)ba._M_head_impl,factory);
  Any::Any<amrex::MultiFab>((Any *)in_RDI,mf);
  MultiFab::~MultiFab((MultiFab *)0x150c761);
  MFInfo::~MFInfo((MFInfo *)0x150c76b);
  BoxArray::~BoxArray(in_R8);
  return (unique_ptr<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>)
         (unique_ptr<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>)
         ba._M_head_impl;
}

Assistant:

Any
MLLinOp::AnyMake (int amrlev, int mglev, IntVect const& ng) const
{
    return Any(MultiFab(amrex::convert(m_grids[amrlev][mglev], m_ixtype),
                        m_dmap[amrlev][mglev], getNComp(), ng, MFInfo(),
                        *m_factory[amrlev][mglev]));
}